

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O0

void __thiscall phoenix_evsa_t::evsa_entry_t::_read(evsa_entry_t *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  evsa_data_t *peVar3;
  evsa_guid_t *peVar4;
  evsa_name_t *peVar5;
  evsa_unknown_t *this_00;
  unique_ptr<phoenix_evsa_t::evsa_unknown_t,_std::default_delete<phoenix_evsa_t::evsa_unknown_t>_>
  local_60;
  unique_ptr<phoenix_evsa_t::evsa_name_t,_std::default_delete<phoenix_evsa_t::evsa_name_t>_>
  local_58;
  unique_ptr<phoenix_evsa_t::evsa_guid_t,_std::default_delete<phoenix_evsa_t::evsa_guid_t>_>
  local_50;
  unique_ptr<phoenix_evsa_t::evsa_name_t,_std::default_delete<phoenix_evsa_t::evsa_name_t>_>
  local_48;
  unique_ptr<phoenix_evsa_t::evsa_guid_t,_std::default_delete<phoenix_evsa_t::evsa_guid_t>_>
  local_40;
  unique_ptr<phoenix_evsa_t::evsa_data_t,_std::default_delete<phoenix_evsa_t::evsa_data_t>_>
  local_38;
  unique_ptr<phoenix_evsa_t::evsa_data_t,_std::default_delete<phoenix_evsa_t::evsa_data_t>_>
  local_30 [3];
  unique_ptr<phoenix_evsa_t::evsa_data_t,_std::default_delete<phoenix_evsa_t::evsa_data_t>_>
  local_18;
  evsa_entry_t *local_10;
  evsa_entry_t *this_local;
  
  local_10 = this;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_entry_type = uVar1;
  this->n_checksum = true;
  uVar1 = entry_type(this);
  if (uVar1 == 0xe1) {
LAB_0018e8cc:
    this->n_checksum = false;
    uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_checksum = uVar1;
  }
  else {
    uVar1 = entry_type(this);
    if (uVar1 == 0xe2) goto LAB_0018e8cc;
    uVar1 = entry_type(this);
    if (uVar1 == 0xe3) goto LAB_0018e8cc;
    uVar1 = entry_type(this);
    if (uVar1 == 0xed) goto LAB_0018e8cc;
    uVar1 = entry_type(this);
    if (uVar1 == 0xee) goto LAB_0018e8cc;
    uVar1 = entry_type(this);
    if (uVar1 == 0xef) goto LAB_0018e8cc;
    uVar1 = entry_type(this);
    if (uVar1 == 0x83) goto LAB_0018e8cc;
  }
  this->n_len_evsa_entry = true;
  uVar1 = entry_type(this);
  if (uVar1 != 0xe1) {
    uVar1 = entry_type(this);
    if (uVar1 != 0xe2) {
      uVar1 = entry_type(this);
      if (uVar1 != 0xe3) {
        uVar1 = entry_type(this);
        if (uVar1 != 0xed) {
          uVar1 = entry_type(this);
          if (uVar1 != 0xee) {
            uVar1 = entry_type(this);
            if (uVar1 != 0xef) {
              uVar1 = entry_type(this);
              if (uVar1 != 0x83) goto LAB_0018e98b;
            }
          }
        }
      }
    }
  }
  this->n_len_evsa_entry = false;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_len_evsa_entry = uVar2;
LAB_0018e98b:
  uVar1 = entry_type(this);
  if (uVar1 == 0x83) {
    peVar3 = (evsa_data_t *)operator_new(0x88);
    evsa_data_t::evsa_data_t(peVar3,(this->super_kstruct).m__io,this,this->m__root);
    std::unique_ptr<phoenix_evsa_t::evsa_data_t,std::default_delete<phoenix_evsa_t::evsa_data_t>>::
    unique_ptr<std::default_delete<phoenix_evsa_t::evsa_data_t>,void>
              ((unique_ptr<phoenix_evsa_t::evsa_data_t,std::default_delete<phoenix_evsa_t::evsa_data_t>>
                *)local_30,peVar3);
    std::unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>>::operator=
              ((unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>> *)&this->m_body,
               local_30);
    std::unique_ptr<phoenix_evsa_t::evsa_data_t,_std::default_delete<phoenix_evsa_t::evsa_data_t>_>
    ::~unique_ptr(local_30);
  }
  else if (uVar1 == 0xe1) {
    peVar4 = (evsa_guid_t *)operator_new(0x48);
    evsa_guid_t::evsa_guid_t(peVar4,(this->super_kstruct).m__io,this,this->m__root);
    std::unique_ptr<phoenix_evsa_t::evsa_guid_t,std::default_delete<phoenix_evsa_t::evsa_guid_t>>::
    unique_ptr<std::default_delete<phoenix_evsa_t::evsa_guid_t>,void>
              ((unique_ptr<phoenix_evsa_t::evsa_guid_t,std::default_delete<phoenix_evsa_t::evsa_guid_t>>
                *)&local_50,peVar4);
    std::unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>>::operator=
              ((unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>> *)&this->m_body,
               &local_50);
    std::unique_ptr<phoenix_evsa_t::evsa_guid_t,_std::default_delete<phoenix_evsa_t::evsa_guid_t>_>
    ::~unique_ptr(&local_50);
  }
  else if (uVar1 == 0xe2) {
    peVar5 = (evsa_name_t *)operator_new(0x48);
    evsa_name_t::evsa_name_t(peVar5,(this->super_kstruct).m__io,this,this->m__root);
    std::unique_ptr<phoenix_evsa_t::evsa_name_t,std::default_delete<phoenix_evsa_t::evsa_name_t>>::
    unique_ptr<std::default_delete<phoenix_evsa_t::evsa_name_t>,void>
              ((unique_ptr<phoenix_evsa_t::evsa_name_t,std::default_delete<phoenix_evsa_t::evsa_name_t>>
                *)&local_48,peVar5);
    std::unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>>::operator=
              ((unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>> *)&this->m_body,
               &local_48);
    std::unique_ptr<phoenix_evsa_t::evsa_name_t,_std::default_delete<phoenix_evsa_t::evsa_name_t>_>
    ::~unique_ptr(&local_48);
  }
  else if (uVar1 == 0xe3) {
    peVar3 = (evsa_data_t *)operator_new(0x88);
    evsa_data_t::evsa_data_t(peVar3,(this->super_kstruct).m__io,this,this->m__root);
    std::unique_ptr<phoenix_evsa_t::evsa_data_t,std::default_delete<phoenix_evsa_t::evsa_data_t>>::
    unique_ptr<std::default_delete<phoenix_evsa_t::evsa_data_t>,void>
              ((unique_ptr<phoenix_evsa_t::evsa_data_t,std::default_delete<phoenix_evsa_t::evsa_data_t>>
                *)&local_38,peVar3);
    std::unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>>::operator=
              ((unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>> *)&this->m_body,
               &local_38);
    std::unique_ptr<phoenix_evsa_t::evsa_data_t,_std::default_delete<phoenix_evsa_t::evsa_data_t>_>
    ::~unique_ptr(&local_38);
  }
  else if (uVar1 == 0xed) {
    peVar4 = (evsa_guid_t *)operator_new(0x48);
    evsa_guid_t::evsa_guid_t(peVar4,(this->super_kstruct).m__io,this,this->m__root);
    std::unique_ptr<phoenix_evsa_t::evsa_guid_t,std::default_delete<phoenix_evsa_t::evsa_guid_t>>::
    unique_ptr<std::default_delete<phoenix_evsa_t::evsa_guid_t>,void>
              ((unique_ptr<phoenix_evsa_t::evsa_guid_t,std::default_delete<phoenix_evsa_t::evsa_guid_t>>
                *)&local_40,peVar4);
    std::unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>>::operator=
              ((unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>> *)&this->m_body,
               &local_40);
    std::unique_ptr<phoenix_evsa_t::evsa_guid_t,_std::default_delete<phoenix_evsa_t::evsa_guid_t>_>
    ::~unique_ptr(&local_40);
  }
  else if (uVar1 == 0xee) {
    peVar5 = (evsa_name_t *)operator_new(0x48);
    evsa_name_t::evsa_name_t(peVar5,(this->super_kstruct).m__io,this,this->m__root);
    std::unique_ptr<phoenix_evsa_t::evsa_name_t,std::default_delete<phoenix_evsa_t::evsa_name_t>>::
    unique_ptr<std::default_delete<phoenix_evsa_t::evsa_name_t>,void>
              ((unique_ptr<phoenix_evsa_t::evsa_name_t,std::default_delete<phoenix_evsa_t::evsa_name_t>>
                *)&local_58,peVar5);
    std::unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>>::operator=
              ((unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>> *)&this->m_body,
               &local_58);
    std::unique_ptr<phoenix_evsa_t::evsa_name_t,_std::default_delete<phoenix_evsa_t::evsa_name_t>_>
    ::~unique_ptr(&local_58);
  }
  else if (uVar1 == 0xef) {
    peVar3 = (evsa_data_t *)operator_new(0x88);
    evsa_data_t::evsa_data_t(peVar3,(this->super_kstruct).m__io,this,this->m__root);
    std::unique_ptr<phoenix_evsa_t::evsa_data_t,std::default_delete<phoenix_evsa_t::evsa_data_t>>::
    unique_ptr<std::default_delete<phoenix_evsa_t::evsa_data_t>,void>
              ((unique_ptr<phoenix_evsa_t::evsa_data_t,std::default_delete<phoenix_evsa_t::evsa_data_t>>
                *)&local_18,peVar3);
    std::unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>>::operator=
              ((unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>> *)&this->m_body,
               &local_18);
    std::unique_ptr<phoenix_evsa_t::evsa_data_t,_std::default_delete<phoenix_evsa_t::evsa_data_t>_>
    ::~unique_ptr(&local_18);
  }
  else {
    this_00 = (evsa_unknown_t *)operator_new(0x40);
    evsa_unknown_t::evsa_unknown_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
    std::
    unique_ptr<phoenix_evsa_t::evsa_unknown_t,std::default_delete<phoenix_evsa_t::evsa_unknown_t>>::
    unique_ptr<std::default_delete<phoenix_evsa_t::evsa_unknown_t>,void>
              ((unique_ptr<phoenix_evsa_t::evsa_unknown_t,std::default_delete<phoenix_evsa_t::evsa_unknown_t>>
                *)&local_60,this_00);
    std::unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>>::operator=
              ((unique_ptr<kaitai::kstruct,std::default_delete<kaitai::kstruct>> *)&this->m_body,
               &local_60);
    std::
    unique_ptr<phoenix_evsa_t::evsa_unknown_t,_std::default_delete<phoenix_evsa_t::evsa_unknown_t>_>
    ::~unique_ptr(&local_60);
  }
  return;
}

Assistant:

void phoenix_evsa_t::evsa_entry_t::_read() {
    m_entry_type = m__io->read_u1();
    n_checksum = true;
    if ( ((entry_type() == 225) || (entry_type() == 226) || (entry_type() == 227) || (entry_type() == 237) || (entry_type() == 238) || (entry_type() == 239) || (entry_type() == 131)) ) {
        n_checksum = false;
        m_checksum = m__io->read_u1();
    }
    n_len_evsa_entry = true;
    if ( ((entry_type() == 225) || (entry_type() == 226) || (entry_type() == 227) || (entry_type() == 237) || (entry_type() == 238) || (entry_type() == 239) || (entry_type() == 131)) ) {
        n_len_evsa_entry = false;
        m_len_evsa_entry = m__io->read_u2le();
    }
    switch (entry_type()) {
    case 239: {
        m_body = std::unique_ptr<evsa_data_t>(new evsa_data_t(m__io, this, m__root));
        break;
    }
    case 131: {
        m_body = std::unique_ptr<evsa_data_t>(new evsa_data_t(m__io, this, m__root));
        break;
    }
    case 227: {
        m_body = std::unique_ptr<evsa_data_t>(new evsa_data_t(m__io, this, m__root));
        break;
    }
    case 237: {
        m_body = std::unique_ptr<evsa_guid_t>(new evsa_guid_t(m__io, this, m__root));
        break;
    }
    case 226: {
        m_body = std::unique_ptr<evsa_name_t>(new evsa_name_t(m__io, this, m__root));
        break;
    }
    case 225: {
        m_body = std::unique_ptr<evsa_guid_t>(new evsa_guid_t(m__io, this, m__root));
        break;
    }
    case 238: {
        m_body = std::unique_ptr<evsa_name_t>(new evsa_name_t(m__io, this, m__root));
        break;
    }
    default: {
        m_body = std::unique_ptr<evsa_unknown_t>(new evsa_unknown_t(m__io, this, m__root));
        break;
    }
    }
}